

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O0

bool __thiscall lunasvg::SVGAngle::parse(SVGAngle *this,string_view input)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_f0;
  SVGAngle *local_e0;
  char *local_d8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_d0;
  SVGAngle *local_c0;
  char *local_b8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b0;
  SVGAngle *local_a0;
  char *local_98;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_90;
  SVGAngle *local_80;
  char *local_78;
  float local_6c;
  undefined1 auStack_68 [4];
  float value;
  SVGAngle *local_58;
  char *local_50;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_48;
  SVGAngle *local_38;
  char *local_30;
  SVGAngle *local_28;
  SVGAngle *this_local;
  string_view input_local;
  
  input_local._M_len = (size_t)input._M_str;
  this_local = (SVGAngle *)input._M_len;
  local_28 = this;
  stripLeadingAndTrailingSpaces((string_view *)&this_local);
  local_38 = this_local;
  local_30 = (char *)input_local._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"auto");
  __x_04._M_str = local_30;
  __x_04._M_len = (size_t)local_38;
  bVar1 = std::operator==(__x_04,local_48);
  if (bVar1) {
    *(undefined4 *)&(this->super_SVGProperty).field_0xc = 0;
    this->m_orientType = Auto;
    input_local._M_str._7_1_ = true;
  }
  else {
    local_58 = this_local;
    local_50 = (char *)input_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_68,"auto-start-reverse");
    __x_03._M_str = local_50;
    __x_03._M_len = (size_t)local_58;
    bVar1 = std::operator==(__x_03,_auStack_68);
    if (bVar1) {
      *(undefined4 *)&(this->super_SVGProperty).field_0xc = 0;
      this->m_orientType = AutoStartReverse;
      input_local._M_str._7_1_ = true;
    }
    else {
      local_6c = 0.0;
      bVar1 = parseNumber<float>((string_view *)&this_local,&local_6c);
      if (bVar1) {
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
        if (!bVar1) {
          local_80 = this_local;
          local_78 = (char *)input_local._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,"rad");
          __x_02._M_str = local_78;
          __x_02._M_len = (size_t)local_80;
          bVar1 = std::operator==(__x_02,local_90);
          if (bVar1) {
            local_6c = local_6c * 57.295776;
          }
          else {
            local_a0 = this_local;
            local_98 = (char *)input_local._M_len;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_b0,"grad");
            __x_01._M_str = local_98;
            __x_01._M_len = (size_t)local_a0;
            bVar1 = std::operator==(__x_01,local_b0);
            if (bVar1) {
              local_6c = local_6c * 0.9;
            }
            else {
              local_c0 = this_local;
              local_b8 = (char *)input_local._M_len;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_d0,"turn");
              __x_00._M_str = local_b8;
              __x_00._M_len = (size_t)local_c0;
              bVar1 = std::operator==(__x_00,local_d0);
              if (bVar1) {
                local_6c = local_6c * 360.0;
              }
              else {
                local_e0 = this_local;
                local_d8 = (char *)input_local._M_len;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_f0,"deg");
                __x._M_str = local_d8;
                __x._M_len = (size_t)local_e0;
                bVar1 = std::operator!=(__x,local_f0);
                if (bVar1) {
                  return false;
                }
              }
            }
          }
        }
        *(float *)&(this->super_SVGProperty).field_0xc = local_6c;
        this->m_orientType = Angle;
        input_local._M_str._7_1_ = true;
      }
      else {
        input_local._M_str._7_1_ = false;
      }
    }
  }
  return input_local._M_str._7_1_;
}

Assistant:

bool SVGAngle::parse(std::string_view input)
{
    stripLeadingAndTrailingSpaces(input);
    if(input == "auto") {
        m_value = 0.f;
        m_orientType = OrientType::Auto;
        return true;
    }

    if(input == "auto-start-reverse") {
        m_value = 0.f;
        m_orientType = OrientType::AutoStartReverse;
        return true;
    }

    float value = 0.f;
    if(!parseNumber(input, value))
        return false;
    if(!input.empty()) {
        if(input == "rad")
            value *= 180.f / PLUTOVG_PI;
        else if(input == "grad")
            value *= 360.f / 400.f;
        else if(input == "turn")
            value *= 360.f;
        else if(input != "deg") {
            return false;
        }
    }

    m_value = value;
    m_orientType = OrientType::Angle;
    return true;
}